

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O0

void bson_iter_array(bson_iter_t *iter,uint32_t *array_len,uint8_t **array)

{
  uint8_t **array_local;
  uint32_t *array_len_local;
  bson_iter_t *iter_local;
  
  if (iter == (bson_iter_t *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
            ,0x712,"bson_iter_array","iter");
    abort();
  }
  if (array_len == (uint32_t *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
            ,0x713,"bson_iter_array","array_len");
    abort();
  }
  if (array == (uint8_t **)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
            ,0x714,"bson_iter_array","array");
    abort();
  }
  *array = (uint8_t *)0x0;
  *array_len = 0;
  if (iter->raw[iter->type] == '\x04') {
    *array_len = *(uint32_t *)(iter->raw + iter->d1);
    *array_len = *array_len;
    *array = iter->raw + iter->d1;
  }
  return;
}

Assistant:

void
bson_iter_array (const bson_iter_t *iter, /* IN */
                 uint32_t *array_len,     /* OUT */
                 const uint8_t **array)   /* OUT */
{
   BSON_ASSERT (iter);
   BSON_ASSERT (array_len);
   BSON_ASSERT (array);

   *array = NULL;
   *array_len = 0;

   if (ITER_TYPE (iter) == BSON_TYPE_ARRAY) {
      memcpy (array_len, (iter->raw + iter->d1), sizeof (*array_len));
      *array_len = BSON_UINT32_FROM_LE (*array_len);
      *array = (iter->raw + iter->d1);
   }
}